

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O0

bool ON_Font::EqualFontFamily(ON_Font *lhs,ON_Font *rhs)

{
  bool bVar1;
  bool bVar2;
  bool local_ac;
  bool local_a9;
  undefined1 local_90 [31];
  FontType local_71;
  undefined1 local_70 [31];
  FontType local_51;
  undefined1 local_50 [6];
  bool rc;
  undefined1 local_48 [24];
  undefined1 local_30 [16];
  ON_wString local_20;
  ON_Font *rhs_local;
  ON_Font *lhs_local;
  
  if ((lhs == (ON_Font *)0x0) || (rhs == (ON_Font *)0x0)) {
    lhs_local._7_1_ = false;
  }
  else if (lhs == rhs) {
    lhs_local._7_1_ = true;
  }
  else {
    local_20.m_s = (wchar_t *)rhs;
    rhs_local = lhs;
    bVar1 = Internal_EqualName(&lhs->m_en_family_name,&rhs->m_en_family_name);
    if (bVar1) {
      lhs_local._7_1_ = true;
    }
    else {
      FamilyName((ON_Font *)(local_30 + 8),(NameLocale)rhs_local);
      FamilyName((ON_Font *)local_30,(NameLocale)local_20.m_s);
      bVar1 = Internal_EqualName((ON_wString *)(local_30 + 8),(ON_wString *)local_30);
      ON_wString::~ON_wString((ON_wString *)local_30);
      ON_wString::~ON_wString((ON_wString *)(local_30 + 8));
      if (bVar1) {
        lhs_local._7_1_ = true;
      }
      else {
        FaceName((ON_Font *)local_48);
        local_51 = Unset;
        bVar1 = ON_wString::IsNotEmpty((ON_wString *)local_48);
        local_a9 = false;
        if (bVar1) {
          FamilyName((ON_Font *)local_50);
          local_51 = ManagedFont;
          local_a9 = ON_wString::IsNotEmpty((ON_wString *)local_50);
        }
        if ((local_51 & ManagedFont) != Unset) {
          ON_wString::~ON_wString((ON_wString *)local_50);
        }
        ON_wString::~ON_wString((ON_wString *)local_48);
        if (local_a9 == false) {
          bVar2 = Internal_EqualName(&rhs_local->m_en_postscript_name,
                                     (ON_wString *)(local_20.m_s + 0xc));
          local_70[0xf] = 0;
          local_71 = Unset;
          local_90[0xf] = 0;
          bVar1 = false;
          local_ac = true;
          if (!bVar2) {
            bVar2 = Internal_EqualName(&rhs_local->m_en_windows_logfont_name,
                                       (ON_wString *)(local_20.m_s + 0x18));
            local_ac = true;
            if (!bVar2) {
              PostScriptName((ON_Font *)(local_70 + 0x10),(NameLocale)rhs_local);
              local_70[0xf] = 1;
              PostScriptName((ON_Font *)local_70,(NameLocale)local_20.m_s);
              local_71 = ManagedFont;
              bVar2 = Internal_EqualName((ON_wString *)(local_70 + 0x10),(ON_wString *)local_70);
              local_ac = true;
              if (!bVar2) {
                WindowsLogfontName((ON_Font *)(local_90 + 0x10),(NameLocale)rhs_local);
                local_90[0xf] = 1;
                WindowsLogfontName((ON_Font *)local_90,(NameLocale)local_20.m_s);
                bVar1 = true;
                local_ac = Internal_EqualName((ON_wString *)(local_90 + 0x10),(ON_wString *)local_90
                                             );
              }
            }
          }
          if (bVar1) {
            ON_wString::~ON_wString((ON_wString *)local_90);
          }
          if ((local_90[0xf] & 1) != 0) {
            ON_wString::~ON_wString((ON_wString *)(local_90 + 0x10));
          }
          if ((local_71 & ManagedFont) != Unset) {
            ON_wString::~ON_wString((ON_wString *)local_70);
          }
          if ((local_70[0xf] & 1) != 0) {
            ON_wString::~ON_wString((ON_wString *)(local_70 + 0x10));
          }
          lhs_local._7_1_ = local_ac;
        }
        else {
          lhs_local._7_1_ = false;
        }
      }
    }
  }
  return lhs_local._7_1_;
}

Assistant:

bool ON_Font::EqualFontFamily(
  const ON_Font* lhs,
  const ON_Font* rhs
)
{
  if (nullptr == lhs || nullptr == rhs)
    return false;
  if (lhs == rhs)
    return true;

  if (Internal_EqualName(lhs->m_en_family_name, rhs->m_en_family_name))
    return true;
  if (Internal_EqualName(lhs->FamilyName(ON_Font::NameLocale::LocalizedFirst), rhs->FamilyName(ON_Font::NameLocale::LocalizedFirst)))
    return true;
  if (lhs->FaceName().IsNotEmpty() && rhs->FamilyName().IsNotEmpty())
    return false; // both lhs and rhs have non-empty family names.

  // Testing PostScript, and LOGFONT names handles cases where the family name is missing.
  const bool rc
    = Internal_EqualName(lhs->m_en_postscript_name, rhs->m_en_postscript_name)
    || Internal_EqualName(lhs->m_en_windows_logfont_name, rhs->m_en_windows_logfont_name)
    || Internal_EqualName(lhs->PostScriptName(ON_Font::NameLocale::LocalizedFirst),rhs->PostScriptName(ON_Font::NameLocale::LocalizedFirst))
    || Internal_EqualName(lhs->WindowsLogfontName(ON_Font::NameLocale::LocalizedFirst),rhs->WindowsLogfontName(ON_Font::NameLocale::LocalizedFirst))
    ;
  return rc;
}